

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utPLYImportExport.cpp
# Opt level: O0

void __thiscall
utPLYImportExport_pointcloudTest_Test::utPLYImportExport_pointcloudTest_Test
          (utPLYImportExport_pointcloudTest_Test *this)

{
  utPLYImportExport_pointcloudTest_Test *this_local;
  
  utPLYImportExport::utPLYImportExport(&this->super_utPLYImportExport);
  (this->super_utPLYImportExport).super_AbstractImportExportBase.super_Test._vptr_Test =
       (_func_int **)&PTR__utPLYImportExport_pointcloudTest_Test_0103b0c8;
  return;
}

Assistant:

TEST_F(utPLYImportExport, pointcloudTest) {
    Assimp::Importer importer;

    //Could not use aiProcess_ValidateDataStructure since it's missing faces.
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/PLY/issue623.ply", 0);
    EXPECT_NE(nullptr, scene);

    EXPECT_EQ(1u, scene->mNumMeshes);
    EXPECT_NE(nullptr, scene->mMeshes[0]);
    EXPECT_EQ(24u, scene->mMeshes[0]->mNumVertices);
    EXPECT_EQ(aiPrimitiveType::aiPrimitiveType_POINT, scene->mMeshes[0]->mPrimitiveTypes);
    EXPECT_EQ(0u, scene->mMeshes[0]->mNumFaces);
}